

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamIGA::SetNodesGenericOrder
          (ChElementBeamIGA *this,
          vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          *mynodes,vector<double,_std::allocator<double>_> *myknots,int myorder)

{
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *this_00;
  ChVectorDynamic<> *this_01;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  pointer psVar6;
  pointer pdVar7;
  double *pdVar8;
  long lVar9;
  undefined8 uVar10;
  ChElementBeamIGA *pCVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  undefined4 in_register_0000000c;
  long lVar15;
  int iVar16;
  long lVar17;
  pointer psVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvars;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_88;
  undefined8 local_68;
  ChVectorDynamic<> *local_60;
  ChElementBeamIGA *local_58;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_50;
  ChVariables *local_38;
  
  local_68 = CONCAT44(in_register_0000000c,myorder);
  this->order = myorder;
  this_00 = &this->nodes;
  iVar13 = myorder + 1;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::resize(this_00,(long)iVar13);
  psVar18 = (mynodes->
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((mynodes->
      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != psVar18) {
    lVar17 = 8;
    uVar21 = 0;
    do {
      psVar6 = (this_00->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)psVar6 + lVar17 + -8) = *(undefined8 *)((long)psVar18 + lVar17 + -8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(psVar6->
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr + lVar17),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(psVar18->
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr + lVar17));
      uVar21 = uVar21 + 1;
      psVar18 = (mynodes->
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar17 = lVar17 + 0x10;
    } while (uVar21 < (ulong)((long)(mynodes->
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar18 >> 4
                             ));
  }
  this_01 = &this->knots;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)(int)local_68 + 1 +
             ((long)(this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  pdVar7 = (myknots->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar17 = (long)(myknots->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar7;
  if (lVar17 != 0) {
    lVar17 = lVar17 >> 3;
    pdVar8 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar21 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    uVar19 = 0;
    do {
      if ((~((long)uVar21 >> 0x3f) & uVar21) == uVar19) goto LAB_0069ca01;
      pdVar8[uVar19] = pdVar7[uVar19];
      uVar19 = uVar19 + 1;
    } while (lVar17 + (ulong)(lVar17 == 0) != uVar19);
  }
  local_88.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (ChVariables **)0x0;
  local_88.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (ChVariables **)0x0;
  local_60 = this_01;
  local_58 = this;
  if ((mynodes->
      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (mynodes->
      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar17 = 0;
    uVar21 = 0;
    do {
      local_38 = (ChVariables *)
                 (**(code **)(**(long **)((long)&(((this_00->
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                                 )._M_ptr + lVar17) + 0x40))();
      if (local_88.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
        _M_realloc_insert<chrono::ChVariables*>
                  ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_88,
                   (iterator)
                   local_88.
                   super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_38);
      }
      else {
        *local_88.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
         _M_impl.super__Vector_impl_data._M_finish = local_38;
        local_88.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_88.
             super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar21 = uVar21 + 1;
      lVar17 = lVar17 + 0x10;
    } while (uVar21 < (ulong)((long)(mynodes->
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(mynodes->
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            (&local_50,&local_88);
  pCVar11 = local_58;
  ChKblockGeneric::SetVariables
            (&(local_58->super_ChElementBeam).super_ChElementGeneric.Kmatr,&local_50);
  if (local_50.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  uVar5 = pCVar11->order;
  lVar17 = (long)(int)uVar5;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = ((double)(int)uVar5 + 1.0) * 0.5;
  auVar24 = vroundsd_avx(auVar24,auVar24,10);
  iVar16 = (int)auVar24._0_8_;
  pCVar11->int_order_b = iVar16;
  iVar12 = quadrature_type;
  if ((((lVar17 < 0) ||
       (lVar9 = (pCVar11->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows, lVar9 <= lVar17)) || (lVar15 = (int)~uVar5 + lVar9, lVar15 < 0))
     || (lVar9 <= lVar15)) {
LAB_0069ca01:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  pdVar8 = (local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  dVar1 = pdVar8[lVar17];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar1;
  dVar2 = pdVar8[lVar15];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar2;
  if (uVar5 == 0) {
    bVar22 = false;
  }
  else {
    lVar15 = lVar17 + 1;
    uVar14 = 1;
    do {
      if (lVar9 < lVar17) goto LAB_0069ca01;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = pdVar8[lVar15 + -2];
      uVar10 = vcmpsd_avx512f(auVar26,auVar3,0);
      uVar14 = uVar14 + ((uint)uVar10 & 1);
      lVar15 = lVar15 + -1;
    } while (1 < lVar15);
    bVar22 = 1 < uVar14;
  }
  if (uVar5 == 0) {
    bVar23 = false;
  }
  else {
    iVar20 = (int)lVar9 - uVar5;
    lVar17 = (long)iVar20;
    uVar14 = 1;
    do {
      if ((iVar20 < 0) || (lVar9 <= lVar17)) goto LAB_0069ca01;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = pdVar8[lVar17];
      uVar10 = vcmpsd_avx512f(auVar25,auVar4,0);
      uVar14 = uVar14 + ((uint)uVar10 & 1);
      lVar17 = lVar17 + 1;
    } while (lVar17 < (int)lVar9);
    bVar23 = 1 < uVar14;
  }
  switch(quadrature_type) {
  case 0:
    pCVar11->int_order_b = iVar13;
    pCVar11->int_order_s = iVar13;
    goto switchD_0069c8ac_default;
  case 1:
    pCVar11->int_order_b = iVar16;
    pCVar11->int_order_s = iVar16;
    goto switchD_0069c8ac_default;
  case 2:
    iVar13 = (int)local_68;
    goto LAB_0069c9bf;
  case 3:
    pCVar11->int_order_s = 1;
    pCVar11->int_order_b = 1;
    if ((bool)(bVar22 | bVar23)) {
      pCVar11->int_order_b = iVar16;
      pCVar11->int_order_s = iVar16;
    }
    if (iVar12 != 5) {
      if (iVar12 != 4) goto switchD_0069c8ac_default;
      goto switchD_0069c8ac_caseD_4;
    }
    break;
  case 4:
switchD_0069c8ac_caseD_4:
    pCVar11->int_order_s = 1;
    pCVar11->int_order_b = 1;
    if (((uVar5 == 2) && (dVar1 < 0.5)) && (0.5 <= dVar2)) {
      pCVar11->int_order_s = 2;
      pCVar11->int_order_b = 2;
    }
    if ((2 < (int)uVar5) && (bVar22 || bVar23)) {
      pCVar11->int_order_b = uVar5 - 1;
      pCVar11->int_order_s = uVar5 - 1;
    }
    if (iVar12 != 5) goto switchD_0069c8ac_default;
    break;
  case 5:
    break;
  default:
    goto switchD_0069c8ac_default;
  }
  pCVar11->int_order_s = 1;
  pCVar11->int_order_b = 1;
  if ((bool)(uVar5 == 2 & bVar23)) {
    pCVar11->int_order_s = 2;
    pCVar11->int_order_b = 2;
  }
  if ((2 < (int)uVar5) && (bVar22 || bVar23)) {
    iVar13 = uVar5 - 1;
LAB_0069c9bf:
    pCVar11->int_order_b = iVar13;
    pCVar11->int_order_s = iVar13;
  }
switchD_0069c8ac_default:
  pCVar11->int_order_s = pCVar11->int_order_b;
  if (local_88.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ChElementBeamIGA::SetNodesGenericOrder(std::vector<std::shared_ptr<ChNodeFEAxyzrot>> mynodes,
                                            std::vector<double> myknots,
                                            int myorder) {
    this->order = myorder;

    nodes.resize(myorder + 1);
    for (int i = 0; i < mynodes.size(); ++i) {
        nodes[i] = mynodes[i];
    }
    knots.resize(nodes.size() + myorder + 1);
    for (int i = 0; i < myknots.size(); ++i) {
        knots(i) = myknots[i];
    }

    std::vector<ChVariables*> mvars;
    for (int i = 0; i < mynodes.size(); ++i) {
        mvars.push_back(&nodes[i]->Variables());
    }
    Kmatr.SetVariables(mvars);

    // integration for in-between elements:
    // int_order_s = 1;

    // FULL OVER INTEGRATION:
    // int_order_b = myorder+1;
    // FULL EXACT INTEGRATION:
    int_order_b = (int)std::ceil((this->order + 1.0) / 2.0);
    // REDUCED INTEGRATION:
    // int_order_b = myorder;
    // SELECTIVE INTEGRATION:
    // int_order_b = 1;

    // ensure integration order is odd, to have a centered gauss point
    // if (int_order_b % 2 == 0) {
    //	int_order_b += 1;
    //}

    bool is_middle = false;
    bool is_end_A = false;
    bool is_end_B = false;

    double u1 = knots(order);
    double u2 = knots(knots.size() - order - 1);

    if (u1 < 0.5 && u2 >= 0.5) {
        // GetLog() << " -- IS_MIDDLE ";
        is_middle = true;
    }
    // Full integration for end elements:
    int multiplicity_a = 1;
    int multiplicity_b = 1;
    for (int im = order - 1; im >= 0; --im) {
        if (knots(im) == knots(order))  // extreme of span
            ++multiplicity_a;
    }
    for (int im = (int)knots.size() - order; im < (int)knots.size(); ++im) {
        if (knots(im) == knots(knots.size() - order - 1))  // extreme of span
            ++multiplicity_b;
    }
    if (multiplicity_a > 1)
        is_end_A = true;
    if (multiplicity_b > 1)
        is_end_B = true;

    if (this->quadrature_type == QuadratureType::FULL_EXACT) {
        int_order_b = (int)std::ceil((this->order + 1.0) / 2.0);
        int_order_s = (int)std::ceil((this->order + 1.0) / 2.0);
    }
    if (this->quadrature_type == QuadratureType::FULL_OVER) {
        int_order_b = myorder + 1;
        int_order_s = myorder + 1;
    }
    if (this->quadrature_type == QuadratureType::REDUCED) {
        int_order_b = myorder;
        int_order_s = myorder;
    }
    if (this->quadrature_type == QuadratureType::SELECTIVE) {
        int_order_b = 1;  // int_order_b = my_order;
        int_order_s = 1;
        if (is_end_A || is_end_B) {
            int_order_b = (int)std::ceil((this->order + 1.0) / 2.0);
            int_order_s = (int)std::ceil((this->order + 1.0) / 2.0);
        }
    }
    if (this->quadrature_type == QuadratureType::CUSTOM1) {
        int_order_b = 1;
        int_order_s = 1;
        if (order == 2) {
            if (is_middle) {
                int_order_s = 2;
                int_order_b = 2;
            }
        }
        if (order >= 3) {
            if (is_end_A || is_end_B) {
                int_order_b = order - 1;
                int_order_s = order - 1;
            }
        }
    }
    if (this->quadrature_type == QuadratureType::URI2) {
        int_order_b = 1;
        int_order_s = 1;
        if (order == 2) {
            if (is_end_B) {
                int_order_s = 2;
                int_order_b = 2;
            }
        }
        if (order >= 3) {
            if (is_end_A || is_end_B) {
                int_order_b = order - 1;
                int_order_s = order - 1;
            }
        }
    }

    // TRICK - FOR THE MOMENT ENSURE NO SELECTIVE CAUSE NOT YET IMPLEMENTED DIFFERENT GAUSS PTS FOR BEND/SHEAR
    int_order_s = int_order_b;

    /*
    GetLog() << "Element order p=" << this->order << ",   u in (" << u1 << ", " << u2 << ")";
    GetLog() << "   orders:  b=" << int_order_b << "   s=" << int_order_s;
    GetLog() << "\n";
    */
}